

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O2

int coda_pcre2_substring_list_get_8
              (pcre2_match_data_8 *match_data,PCRE2_UCHAR8 ***listptr,size_t **lengthsptr)

{
  PCRE2_UCHAR8 **ppPVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  size_t *psVar7;
  size_t size;
  size_t __n;
  ulong uVar8;
  size_t *__dest;
  undefined1 *puVar9;
  
  uVar6 = match_data->rc;
  if (-1 < (int)uVar6) {
    if (uVar6 == 0) {
      uVar6 = (uint)match_data->oveccount;
    }
    uVar8 = (ulong)uVar6;
    size = 0x20;
    if (lengthsptr != (size_t **)0x0) {
      size = uVar8 * 8 + 0x20;
    }
    for (uVar3 = 0; uVar3 < uVar6 * 2; uVar3 = uVar3 + 2) {
      lVar5 = 0;
      if (match_data->ovector[uVar3] <= match_data->ovector[uVar3 + 1]) {
        lVar5 = match_data->ovector[uVar3 + 1] - match_data->ovector[uVar3];
      }
      size = size + lVar5 + 9;
    }
    pvVar4 = coda__pcre2_memctl_malloc_8(size,&match_data->memctl);
    if (pvVar4 == (void *)0x0) {
      uVar6 = 0xffffffd0;
    }
    else {
      ppPVar1 = (PCRE2_UCHAR8 **)((long)pvVar4 + 0x18);
      *listptr = ppPVar1;
      __dest = (size_t *)((long)pvVar4 + uVar8 * 8 + 0x20);
      if (lengthsptr == (size_t **)0x0) {
        psVar7 = (size_t *)0x0;
      }
      else {
        *lengthsptr = __dest;
        psVar7 = __dest;
        __dest = __dest + uVar8;
      }
      for (uVar8 = 0; uVar8 < uVar6 * 2; uVar8 = uVar8 + 2) {
        uVar3 = match_data->ovector[uVar8];
        uVar2 = match_data->ovector[uVar8 + 1];
        __n = 0;
        if (uVar3 <= uVar2) {
          __n = uVar2 - uVar3;
        }
        if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
          memcpy(__dest,match_data->subject + uVar3,__n);
        }
        *(size_t **)((long)ppPVar1 + uVar8 * 4) = __dest;
        if (psVar7 == (size_t *)0x0) {
          psVar7 = (size_t *)0x0;
        }
        else {
          *psVar7 = __n;
          psVar7 = psVar7 + 1;
        }
        puVar9 = (undefined1 *)((long)__dest + __n);
        __dest = (size_t *)(puVar9 + 1);
        *puVar9 = 0;
      }
      *(undefined8 *)((long)ppPVar1 + uVar8 * 4) = 0;
      uVar6 = 0;
    }
  }
  return uVar6;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_list_get(pcre2_match_data *match_data, PCRE2_UCHAR ***listptr,
  PCRE2_SIZE **lengthsptr)
{
int i, count, count2;
PCRE2_SIZE size;
PCRE2_SIZE *lensp;
pcre2_memctl *memp;
PCRE2_UCHAR **listp;
PCRE2_UCHAR *sp;
PCRE2_SIZE *ovector;

if ((count = match_data->rc) < 0) return count;   /* Match failed */
if (count == 0) count = match_data->oveccount;    /* Ovector too small */

count2 = 2*count;
ovector = match_data->ovector;
size = sizeof(pcre2_memctl) + sizeof(PCRE2_UCHAR *);      /* For final NULL */
if (lengthsptr != NULL) size += sizeof(PCRE2_SIZE) * count;  /* For lengths */

for (i = 0; i < count2; i += 2)
  {
  size += sizeof(PCRE2_UCHAR *) + CU2BYTES(1);
  if (ovector[i+1] > ovector[i]) size += CU2BYTES(ovector[i+1] - ovector[i]);
  }

memp = PRIV(memctl_malloc)(size, (pcre2_memctl *)match_data);
if (memp == NULL) return PCRE2_ERROR_NOMEMORY;

*listptr = listp = (PCRE2_UCHAR **)((char *)memp + sizeof(pcre2_memctl));
lensp = (PCRE2_SIZE *)((char *)listp + sizeof(PCRE2_UCHAR *) * (count + 1));

if (lengthsptr == NULL)
  {
  sp = (PCRE2_UCHAR *)lensp;
  lensp = NULL;
  }
else
  {
  *lengthsptr = lensp;
  sp = (PCRE2_UCHAR *)((char *)lensp + sizeof(PCRE2_SIZE) * count);
  }

for (i = 0; i < count2; i += 2)
  {
  size = (ovector[i+1] > ovector[i])? (ovector[i+1] - ovector[i]) : 0;

  /* Size == 0 includes the case when the capture is unset. Avoid adding
  PCRE2_UNSET to match_data->subject because it overflows, even though with
  zero size calling memcpy() is harmless. */

  if (size != 0) memcpy(sp, match_data->subject + ovector[i], CU2BYTES(size));
  *listp++ = sp;
  if (lensp != NULL) *lensp++ = size;
  sp += size;
  *sp++ = 0;
  }

*listp = NULL;
return 0;
}